

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<FString,_FString>::Delete(TArray<FString,_FString> *this,uint index,int deletecount)

{
  int local_1c;
  int local_18;
  int i;
  int deletecount_local;
  uint index_local;
  TArray<FString,_FString> *this_local;
  
  local_18 = deletecount;
  if (this->Count < index + deletecount) {
    local_18 = this->Count - index;
  }
  if (0 < local_18) {
    for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
      FString::~FString(this->Array + (index + local_1c));
    }
    this->Count = this->Count - local_18;
    if (index < this->Count) {
      memmove(this->Array + index,this->Array + (index + local_18),(ulong)(this->Count - index) << 3
             );
    }
  }
  return;
}

Assistant:

void Delete (unsigned int index, int deletecount)
	{
		if (index + deletecount > Count)
		{
			deletecount = Count - index;
		}
		if (deletecount > 0)
		{
			for (int i = 0; i < deletecount; i++)
			{
				Array[index + i].~T();
			}
			Count -= deletecount;
			if (index < Count)
			{
				memmove (&Array[index], &Array[index+deletecount], sizeof(T)*(Count - index));
			}
		}
	}